

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void do_stepb_divide(void *pA,void *pB,void *pC,Integer nelems,Integer type)

{
  float fVar1;
  double dVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  Integer i_0;
  float f_0;
  long l_0;
  double d_0;
  Integer i;
  Integer in_stack_00000148;
  char *in_stack_00000150;
  long local_30;
  
  switch(in_R8) {
  case 0x3e9:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      if (*(int *)(in_RDI + local_30 * 4) == 0) {
        if (*(int *)(in_RSI + local_30 * 4) < 1) {
          *(undefined4 *)(in_RDX + local_30 * 4) = 0x7fffffff;
        }
        else {
          *(undefined4 *)(in_RDX + local_30 * 4) = 0;
        }
      }
      else if (*(int *)(in_RSI + local_30 * 4) == 0) {
        *(undefined4 *)(in_RDX + local_30 * 4) = 0x7fffffff;
      }
      else {
        *(int *)(in_RDX + local_30 * 4) =
             *(int *)(in_RDI + local_30 * 4) / *(int *)(in_RSI + local_30 * 4);
      }
    }
    break;
  case 0x3ea:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      if (*(long *)(in_RDI + local_30 * 8) == 0) {
        if (*(long *)(in_RSI + local_30 * 8) < 1) {
          *(undefined8 *)(in_RDX + local_30 * 8) = 0x7fffffffffffffff;
        }
        else {
          *(undefined8 *)(in_RDX + local_30 * 8) = 0;
        }
      }
      else if (*(long *)(in_RSI + local_30 * 8) == 0) {
        *(undefined8 *)(in_RDX + local_30 * 8) = 0x7fffffffffffffff;
      }
      else {
        *(long *)(in_RDX + local_30 * 8) =
             *(long *)(in_RDI + local_30 * 8) / *(long *)(in_RSI + local_30 * 8);
      }
    }
    break;
  case 0x3eb:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      fVar1 = *(float *)(in_RDI + local_30 * 4);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        fVar1 = *(float *)(in_RSI + local_30 * 4);
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          *(float *)(in_RDX + local_30 * 4) =
               *(float *)(in_RDI + local_30 * 4) / *(float *)(in_RSI + local_30 * 4);
        }
        else {
          *(undefined4 *)(in_RDX + local_30 * 4) = 0x7cf0bdc2;
        }
      }
      else if (*(float *)(in_RSI + local_30 * 4) <= 0.0) {
        *(undefined4 *)(in_RDX + local_30 * 4) = 0x7cf0bdc2;
      }
      else {
        *(undefined4 *)(in_RDX + local_30 * 4) = 0;
      }
    }
    break;
  case 0x3ec:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      dVar2 = *(double *)(in_RDI + local_30 * 8);
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        dVar2 = *(double *)(in_RSI + local_30 * 8);
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          *(double *)(in_RDX + local_30 * 8) =
               *(double *)(in_RDI + local_30 * 8) / *(double *)(in_RSI + local_30 * 8);
        }
        else {
          *(undefined8 *)(in_RDX + local_30 * 8) = 0x7fac7b1f3cac7433;
        }
      }
      else if (*(double *)(in_RSI + local_30 * 8) <= 0.0) {
        *(undefined8 *)(in_RDX + local_30 * 8) = 0x7fac7b1f3cac7433;
      }
      else {
        *(undefined8 *)(in_RDX + local_30 * 8) = 0;
      }
    }
    break;
  default:
    pnga_error(in_stack_00000150,in_stack_00000148);
    break;
  case 0x3ee:
    pnga_error(in_stack_00000150,in_stack_00000148);
    break;
  case 0x3ef:
    pnga_error(in_stack_00000150,in_stack_00000148);
  }
  return;
}

Assistant:

static void do_stepb_divide(void *pA, void *pB, void *pC, Integer nelems, Integer type){
  /* Elementwise divide, not aborting on a zero denominator, but
     returning an infinity. If an element in the numerator vector (PA)
     is zero, then infinity is returned if the corresponding denominator
     element is non-negative, else zero is returned for that element.
     DJB 4/02/04
  */
  Integer i;
  double d_0;
  long l_0;
  float f_0;
  Integer i_0;

  d_0 = (double)0.0;
  l_0 = (long)0;
  f_0 = (float)0.0;
  i_0 = (int)0;
  switch(type){
  
  case C_DBL:
    for(i = 0; i<nelems; i++) {
      if(((double*)pA)[i] == d_0) {
	if(((double*)pB)[i]>d_0) {
	  ((double*)pC)[i]=  d_0;
	} else {
	  ((double*)pC)[i]=  GA_INFINITY_D;
	}
      } else {
	if(((double*)pB)[i]!=d_0)
	  ((double*)pC)[i]=  ((double*)pA)[i]/((double*)pB)[i];
	else{
	  /* if b is zero an infinite number could be added without
	     changing the sign of a.
	  */
	  ((double*)pC)[i]=  GA_INFINITY_D;
	}
      }
    }
    break;
  case C_DCPL:
    pnga_error(" do_stepb_divide called with type C_DCPL",C_DCPL);
    break;
  case C_SCPL:
    pnga_error(" do_stepb_divide called with type C_SCPL",C_SCPL);
    break;
  case C_INT:
    i_0 = (int)0;
    for(i = 0; i<nelems; i++){
      if(((int*)pA)[i]==i_0) {
	if(((int*)pB)[i]>i_0) {
	  ((int*)pC)[i]=i_0;
	} else {
	  ((int*)pC)[i]=GA_INFINITY_I;
	}
      } else {
	if(((int*)pB)[i]!=i_0)
	  ((int*)pC)[i] = ((int*)pA)[i]/((int*)pB)[i];
	else{
	  ((int*)pC)[i]=GA_INFINITY_I;
	}
      } 
    }
    break;
  case C_FLOAT:
    f_0 = (float)0.0;
    for(i = 0; i<nelems; i++){
      if(((float*)pA)[i]==f_0) {
	if(((float*)pB)[i]>f_0) {
	  ((float*)pC)[i]= f_0;
	} else {
	  ((float*)pC)[i]= GA_INFINITY_F;
	}
      } else {
	if(((float*)pB)[i]!=f_0) {
	  ((float*)pC)[i]=  ((float*)pA)[i]/((float*)pB)[i];
	} else {
	/* _F added 01/24/04 */
	  ((float*)pC)[i]= GA_INFINITY_F;
	}
      }
    }
    break;
  case C_LONG:
    l_0 = (long)0;
    for(i = 0; i<nelems; i++){
      if(((long *)pA)[i]==l_0) {
	if(((long *)pB)[i]>l_0) {
	  ((long *)pC)[i] = l_0;
	} else {
	  ((long *)pC)[i] = GA_INFINITY_L;
	}
      } else {
	if(((long *)pB)[i]!=l_0)
	  ((long *)pC)[i]=  ((long *)pA)[i]/((long *)pB)[i];
	else{
	  ((long *)pC)[i] = GA_INFINITY_L;
	}
      }
    }
    break;		
  default: pnga_error(" do_stepb_divide: wrong data type ",type);
  }
}